

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

Vec_Int_t * Wlc_NtkCollectOneType(Wlc_Ntk_t *p,Vec_Int_t *vMemObjsClean,int Type1,int Type2)

{
  int Id;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar1;
  int i;
  
  p_00 = Vec_IntAlloc(100);
  for (i = 0; i < vMemObjsClean->nSize; i = i + 1) {
    Id = Vec_IntEntry(vMemObjsClean,i);
    pWVar1 = Wlc_NtkObj(p,Id);
    if ((*(ushort *)pWVar1 & 0x3f) == Type1 || (*(ushort *)pWVar1 & 0x3f) == Type2) {
      Vec_IntPush(p_00,(int)(((long)pWVar1 - (long)p->pObjs) / 0x18));
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectOneType( Wlc_Ntk_t * p, Vec_Int_t * vMemObjsClean, int Type1, int Type2 )
{
    Wlc_Obj_t * pObj; int i;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
        if ( Wlc_ObjType(pObj) == Type1 || Wlc_ObjType(pObj) == Type2 )
            Vec_IntPush( vRes, Wlc_ObjId(p, pObj) );
    return vRes;
}